

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareRootUnscentedKalmanFilter.cpp
# Opt level: O3

void __thiscall
SquareRootUnscentedKalmanFilter_init_Test::TestBody(SquareRootUnscentedKalmanFilter_init_Test *this)

{
  bool bVar1;
  char *in_R9;
  undefined1 local_220 [8];
  SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  SquareRootUnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> ukfMatrix;
  AssertionResult gtest_ar_;
  AssertHelper local_40;
  Message local_38;
  AssertionResult gtest_ar__1;
  
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x13] = 1.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x14] = 2.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.alpha = 1.0;
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::computeWeights
            ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)local_220);
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
  super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  local_220._0_4_ = 0.0;
  local_220._4_4_ = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma = 1.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda = 0.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 1.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 1.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]._0_1_ = 1;
  ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
  super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info._0_1_ =
       Kalman::Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::isIdentity
                 ((Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                  &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if ((bool)(undefined1)
            ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
            super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
            super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ukfMatrix.super_UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.sigmaStatePoints
    .super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x13] = 1.0;
    ukfMatrix.super_UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.sigmaStatePoints
    .super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x14] = 2.0;
    ukfMatrix.super_UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.alpha = 1.0;
    Kalman::UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::computeWeights
              ((UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
               &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
                super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info);
    ukfMatrix.super_UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_KalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.x.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
    stack0xfffffffffffffec0 = (char *)0x0;
    ukfMatrix.super_UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.gamma = 1.0;
    ukfMatrix.super_UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.lambda = 0.0;
    ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 1.0;
    ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
    ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
    ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 1.0;
    ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]._0_1_ = 1;
    local_38.ss_.ptr_._0_1_ =
         (internal)
         Kalman::Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::isIdentity
                   ((Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                    &ukfMatrix.super_UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                     .gamma);
    gtest_ar__1.success_ = false;
    gtest_ar__1._1_7_ = 0;
    if (!(bool)local_38.ss_.ptr_._0_1_) {
      testing::Message::Message((Message *)&gtest_ar__1.message_);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                  super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info,(internal *)&local_38,
                 (AssertionResult *)"ukfMatrix.S.isIdentity()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                 ,0x12,(char *)CONCAT71(stack0xffffffffffffffa1,
                                        (undefined1)
                                        ukfMatrix.
                                        super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                        .super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                        S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info))
      ;
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&gtest_ar__1.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT71(stack0xffffffffffffffa1,
                      (undefined1)
                      ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                      super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                      super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info) !=
          &gtest_ar_.message_) {
        operator_delete((undefined1 *)
                        CONCAT71(stack0xffffffffffffffa1,
                                 (undefined1)
                                 ukfMatrix.
                                 super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                 super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                                 super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info));
      }
      if (gtest_ar__1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (gtest_ar__1.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar__1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::Message::Message(&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
                super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info,
               (internal *)
               &ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info,
               (AssertionResult *)"ukf.S.isIdentity()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
               ,0xe,stack0xfffffffffffffec0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    if ((float *)stack0xfffffffffffffec0 !=
        (float *)((long)&ukfMatrix.
                         super_UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                         super_KalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.x.
                         super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data + 8U)) {
      operator_delete(stack0xfffffffffffffec0);
    }
    if (CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return;
}

Assistant:

TEST(SquareRootUnscentedKalmanFilter, init) {
    auto ukf = SquareRootUnscentedKalmanFilter<Vector<T, 3>>(1,2,1);
    ASSERT_TRUE(ukf.S.isIdentity()); // S should be identity

    // Same as above, but with general matrix type instead of vector
    auto ukfMatrix = SquareRootUnscentedKalmanFilter<Matrix<T, 3, 1>>(1,2,1);
    ASSERT_TRUE(ukfMatrix.S.isIdentity()); // S should be identity
}